

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImDrawList::ChannelsSplit(ImDrawList *this,int channels_count)

{
  undefined8 *puVar1;
  int *piVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  ImDrawChannel *pIVar6;
  void *pvVar7;
  ImVec4 *pIVar8;
  undefined8 uVar9;
  void *__src;
  ImDrawChannel *__dest;
  long lVar10;
  void *pvVar11;
  char *__function;
  long lVar12;
  int iVar13;
  ulong uVar14;
  undefined4 uStack_34;
  
  if ((this->_ChannelsCurrent != 0) || (this->_ChannelsCount != 1)) {
    __assert_fail("_ChannelsCurrent == 0 && _ChannelsCount == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui_draw.cpp"
                  ,0x20e,"void ImDrawList::ChannelsSplit(int)");
  }
  iVar3 = (this->_Channels).Size;
  iVar13 = iVar3;
  if (iVar3 < channels_count) {
    iVar13 = (this->_Channels).Capacity;
    if (iVar13 < channels_count) {
      if (iVar13 == 0) {
        iVar13 = 8;
      }
      else {
        iVar13 = iVar13 / 2 + iVar13;
      }
      if (iVar13 <= channels_count) {
        iVar13 = channels_count;
      }
      __dest = (ImDrawChannel *)ImGui::MemAlloc((long)iVar13 << 5);
      pIVar6 = (this->_Channels).Data;
      if (pIVar6 != (ImDrawChannel *)0x0) {
        memcpy(__dest,pIVar6,(long)(this->_Channels).Size << 5);
        ImGui::MemFree((this->_Channels).Data);
      }
      (this->_Channels).Data = __dest;
      (this->_Channels).Capacity = iVar13;
    }
    (this->_Channels).Size = channels_count;
    iVar13 = channels_count;
  }
  this->_ChannelsCount = channels_count;
  if (0 < iVar13) {
    pIVar6 = (this->_Channels).Data;
    (pIVar6->IdxBuffer).Size = 0;
    (pIVar6->IdxBuffer).Capacity = 0;
    (pIVar6->IdxBuffer).Data = (unsigned_short *)0x0;
    (pIVar6->CmdBuffer).Size = 0;
    (pIVar6->CmdBuffer).Capacity = 0;
    (pIVar6->CmdBuffer).Data = (ImDrawCmd *)0x0;
    if (1 < channels_count) {
      uVar14 = 1;
      lVar12 = 0x38;
      do {
        lVar10 = (long)(this->_Channels).Size;
        if ((long)uVar14 < (long)iVar3) {
          if (lVar10 <= (long)uVar14) goto LAB_001245bf;
          pIVar6 = (this->_Channels).Data;
          if (*(int *)((long)pIVar6 + lVar12 + -0x14) < 0) {
            pvVar11 = ImGui::MemAlloc(0);
            pvVar7 = *(void **)((long)pIVar6 + lVar12 + -0x10);
            if (pvVar7 != (void *)0x0) {
              memcpy(pvVar11,pvVar7,(long)*(int *)((long)pIVar6 + lVar12 + -0x18) * 0x30);
              ImGui::MemFree(*(void **)((long)pIVar6 + lVar12 + -0x10));
            }
            *(void **)((long)pIVar6 + lVar12 + -0x10) = pvVar11;
            *(undefined4 *)((long)pIVar6 + lVar12 + -0x14) = 0;
            lVar10 = (long)(this->_Channels).Size;
          }
          *(undefined4 *)((long)pIVar6 + lVar12 + -0x18) = 0;
          if (lVar10 <= (long)uVar14) goto LAB_001245bf;
          pIVar6 = (this->_Channels).Data;
          if (*(int *)((long)pIVar6 + lVar12 + -4) < 0) {
            pvVar11 = ImGui::MemAlloc(0);
            pvVar7 = *(void **)((long)&(pIVar6->CmdBuffer).Size + lVar12);
            if (pvVar7 != (void *)0x0) {
              memcpy(pvVar11,pvVar7,(long)*(int *)((long)pIVar6 + lVar12 + -8) * 2);
              ImGui::MemFree(*(void **)((long)&(pIVar6->CmdBuffer).Size + lVar12));
            }
            *(void **)((long)&(pIVar6->CmdBuffer).Size + lVar12) = pvVar11;
            *(undefined4 *)((long)pIVar6 + lVar12 + -4) = 0;
          }
          *(undefined4 *)((long)pIVar6 + lVar12 + -8) = 0;
        }
        else {
          if (lVar10 <= (long)uVar14) goto LAB_001245bf;
          pIVar6 = (this->_Channels).Data;
          puVar1 = (undefined8 *)((long)pIVar6 + lVar12 + -8);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)pIVar6 + lVar12 + -0x18);
          *puVar1 = 0;
          puVar1[1] = 0;
        }
        if ((long)(this->_Channels).Size <= (long)uVar14) goto LAB_001245bf;
        pIVar6 = (this->_Channels).Data;
        if (*(int *)((long)pIVar6 + lVar12 + -0x18) == 0) {
          lVar10 = (long)(this->_ClipRectStack).Size;
          if (lVar10 < 1) {
            __function = "T &ImVector<ImVec4>::back() [T = ImVec4]";
LAB_0012460a:
            __assert_fail("Size > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui.h"
                          ,0x4e1,__function);
          }
          pIVar8 = (this->_ClipRectStack).Data;
          fVar4 = pIVar8[lVar10 + -1].x;
          fVar5 = pIVar8[lVar10 + -1].w;
          uVar9 = *(undefined8 *)&pIVar8[lVar10 + -1].y;
          lVar10 = (long)(this->_TextureIdStack).Size;
          if (lVar10 < 1) {
            __function = "T &ImVector<void *>::back() [T = void *]";
            goto LAB_0012460a;
          }
          pvVar7 = (this->_TextureIdStack).Data[lVar10 + -1];
          if (*(int *)((long)pIVar6 + lVar12 + -0x14) == 0) {
            pvVar11 = ImGui::MemAlloc(0x180);
            __src = *(void **)((long)pIVar6 + lVar12 + -0x10);
            if (__src != (void *)0x0) {
              memcpy(pvVar11,__src,(long)*(int *)((long)pIVar6 + lVar12 + -0x18) * 0x30);
              ImGui::MemFree(*(void **)((long)pIVar6 + lVar12 + -0x10));
            }
            *(void **)((long)pIVar6 + lVar12 + -0x10) = pvVar11;
            *(undefined4 *)((long)pIVar6 + lVar12 + -0x14) = 8;
            lVar10 = (long)*(int *)((long)pIVar6 + lVar12 + -0x18);
          }
          else {
            pvVar11 = *(void **)((long)pIVar6 + lVar12 + -0x10);
            lVar10 = 0;
          }
          lVar10 = lVar10 * 0x30;
          *(ulong *)((long)pvVar11 + lVar10) = (ulong)(uint)fVar4 << 0x20;
          puVar1 = (undefined8 *)((long)pvVar11 + lVar10 + 8);
          *puVar1 = uVar9;
          puVar1[1] = CONCAT44(uStack_34,fVar5);
          *(void **)((long)pvVar11 + lVar10 + 0x18) = pvVar7;
          puVar1 = (undefined8 *)((long)pvVar11 + lVar10 + 0x20);
          *puVar1 = 0;
          puVar1[1] = 0;
          piVar2 = (int *)((long)pIVar6 + lVar12 + -0x18);
          *piVar2 = *piVar2 + 1;
        }
        uVar14 = uVar14 + 1;
        lVar12 = lVar12 + 0x20;
      } while ((uint)channels_count != uVar14);
    }
    return;
  }
LAB_001245bf:
  __assert_fail("i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui.h"
                ,0x4d7,"T &ImVector<ImDrawChannel>::operator[](int) [T = ImDrawChannel]");
}

Assistant:

void ImDrawList::ChannelsSplit(int channels_count)
{
    IM_ASSERT(_ChannelsCurrent == 0 && _ChannelsCount == 1);
    int old_channels_count = _Channels.Size;
    if (old_channels_count < channels_count)
        _Channels.resize(channels_count);
    _ChannelsCount = channels_count;

    // _Channels[] (24/32 bytes each) hold storage that we'll swap with this->_CmdBuffer/_IdxBuffer
    // The content of _Channels[0] at this point doesn't matter. We clear it to make state tidy in a debugger but we don't strictly need to.
    // When we switch to the next channel, we'll copy _CmdBuffer/_IdxBuffer into _Channels[0] and then _Channels[1] into _CmdBuffer/_IdxBuffer
    memset(&_Channels[0], 0, sizeof(ImDrawChannel));
    for (int i = 1; i < channels_count; i++)
    {
        if (i >= old_channels_count)
        {
            IM_PLACEMENT_NEW(&_Channels[i]) ImDrawChannel();
        }
        else
        {
            _Channels[i].CmdBuffer.resize(0);
            _Channels[i].IdxBuffer.resize(0);
        }
        if (_Channels[i].CmdBuffer.Size == 0)
        {
            ImDrawCmd draw_cmd;
            draw_cmd.ClipRect = _ClipRectStack.back();
            draw_cmd.TextureId = _TextureIdStack.back();
            _Channels[i].CmdBuffer.push_back(draw_cmd);
        }
    }
}